

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::BeginComboPopup(ImGuiID popup_id,ImRect *bb,ImGuiComboFlags flags)

{
  float fVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  ImGuiWindow *window;
  uint uVar6;
  float fVar7;
  float fVar8;
  char name [16];
  ImRect r_outer;
  ImVec2 pos;
  ImVec2 size_expected;
  ImVec2 local_78 [3];
  ImRect *local_60;
  ImVec2 local_58;
  ImRect local_50;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar2 = GImGui;
  bVar3 = IsPopupOpen(popup_id,0);
  if (bVar3) {
    fVar7 = (bb->Max).x - (bb->Min).x;
    local_60 = bb;
    if (((pIVar2->NextWindowData).Flags & 0x10) == 0) {
      uVar6 = flags | 4;
      if ((flags & 0x1eU) != 0) {
        uVar6 = flags;
      }
      uVar5 = (uVar6 & 0x1e) - 1;
      if ((uVar6 & 0x1e ^ uVar5) <= uVar5) {
        __assert_fail("ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_)",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_widgets.cpp"
                      ,0x67c,"bool ImGui::BeginComboPopup(ImGuiID, const ImRect &, ImGuiComboFlags)"
                     );
      }
      uVar5 = 8;
      if (((uVar6 & 4) == 0) && (uVar5 = 4, (uVar6 & 2) == 0)) {
        uVar5 = -(uint)((uVar6 & 8) == 0) | 0x14;
      }
      local_78[0].y = 0.0;
      if ((int)uVar5 < 1) {
        fVar8 = 3.4028235e+38;
      }
      else {
        fVar8 = (GImGui->Style).WindowPadding.y;
        fVar1 = (GImGui->Style).ItemSpacing.y;
        fVar8 = fVar8 + fVar8 + ((float)(int)uVar5 * (GImGui->FontSize + fVar1) - fVar1);
      }
      local_50.Min.y = fVar8;
      local_50.Min.x = 3.4028235e+38;
      local_78[0].x = fVar7;
      SetNextWindowSizeConstraints(local_78,&local_50.Min,(ImGuiSizeCallback)0x0,(void *)0x0);
      flags = uVar6;
    }
    else {
      fVar8 = (pIVar2->NextWindowData).SizeConstraintRect.Min.x;
      uVar6 = -(uint)(fVar7 <= fVar8);
      (pIVar2->NextWindowData).SizeConstraintRect.Min.x =
           (float)(~uVar6 & (uint)fVar7 | (uint)fVar8 & uVar6);
    }
    ImFormatString((char *)local_78,0x10,"##Combo_%02d",(ulong)(uint)(pIVar2->BeginPopupStack).Size)
    ;
    window = FindWindowByName((char *)local_78);
    if ((window != (ImGuiWindow *)0x0) && (window->WasActive == true)) {
      local_38 = CalcWindowNextAutoFitSize(window);
      window->AutoPosLastDirection = (uint)((flags & 1U) == 0) * 3;
      local_50 = GetPopupAllowedExtentRect(window);
      local_58.y = (local_60->Max).y;
      local_58.x = (local_60->Min).x;
      local_40 = FindBestWindowPosForPopupEx
                           (&local_58,&local_38,&window->AutoPosLastDirection,&local_50,local_60,
                            ImGuiPopupPositionPolicy_ComboBox);
      local_58.x = 0.0;
      local_58.y = 0.0;
      SetNextWindowPos(&local_40,0,&local_58);
    }
    local_50.Min.y = (pIVar2->Style).WindowPadding.y;
    local_50.Min.x = (pIVar2->Style).FramePadding.x;
    PushStyleVar(2,&local_50.Min);
    bVar4 = Begin((char *)local_78,(bool *)0x0,0x4000147);
    PopStyleVar(1);
    if (!bVar4) {
      EndPopup();
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_widgets.cpp"
                    ,0x69e,"bool ImGui::BeginComboPopup(ImGuiID, const ImRect &, ImGuiComboFlags)");
    }
  }
  else {
    (pIVar2->NextWindowData).Flags = 0;
  }
  return bVar3;
}

Assistant:

bool ImGui::BeginComboPopup(ImGuiID popup_id, const ImRect& bb, ImGuiComboFlags flags)
{
    ImGuiContext& g = *GImGui;
    if (!IsPopupOpen(popup_id, ImGuiPopupFlags_None))
    {
        g.NextWindowData.ClearFlags();
        return false;
    }

    // Set popup size
    float w = bb.GetWidth();
    if (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint)
    {
        g.NextWindowData.SizeConstraintRect.Min.x = ImMax(g.NextWindowData.SizeConstraintRect.Min.x, w);
    }
    else
    {
        if ((flags & ImGuiComboFlags_HeightMask_) == 0)
            flags |= ImGuiComboFlags_HeightRegular;
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_)); // Only one
        int popup_max_height_in_items = -1;
        if (flags & ImGuiComboFlags_HeightRegular)     popup_max_height_in_items = 8;
        else if (flags & ImGuiComboFlags_HeightSmall)  popup_max_height_in_items = 4;
        else if (flags & ImGuiComboFlags_HeightLarge)  popup_max_height_in_items = 20;
        SetNextWindowSizeConstraints(ImVec2(w, 0.0f), ImVec2(FLT_MAX, CalcMaxPopupHeightFromItemCount(popup_max_height_in_items)));
    }

    // This is essentially a specialized version of BeginPopupEx()
    char name[16];
    ImFormatString(name, IM_ARRAYSIZE(name), "##Combo_%02d", g.BeginPopupStack.Size); // Recycle windows based on depth

    // Set position given a custom constraint (peak into expected window size so we can position it)
    // FIXME: This might be easier to express with an hypothetical SetNextWindowPosConstraints() function?
    // FIXME: This might be moved to Begin() or at least around the same spot where Tooltips and other Popups are calling FindBestWindowPosForPopupEx()?
    if (ImGuiWindow* popup_window = FindWindowByName(name))
        if (popup_window->WasActive)
        {
            // Always override 'AutoPosLastDirection' to not leave a chance for a past value to affect us.
            ImVec2 size_expected = CalcWindowNextAutoFitSize(popup_window);
            popup_window->AutoPosLastDirection = (flags & ImGuiComboFlags_PopupAlignLeft) ? ImGuiDir_Left : ImGuiDir_Down; // Left = "Below, Toward Left", Down = "Below, Toward Right (default)"
            ImRect r_outer = GetPopupAllowedExtentRect(popup_window);
            ImVec2 pos = FindBestWindowPosForPopupEx(bb.GetBL(), size_expected, &popup_window->AutoPosLastDirection, r_outer, bb, ImGuiPopupPositionPolicy_ComboBox);
            SetNextWindowPos(pos);
        }

    // We don't use BeginPopupEx() solely because we have a custom name string, which we could make an argument to BeginPopupEx()
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_Popup | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoMove;
    PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(g.Style.FramePadding.x, g.Style.WindowPadding.y)); // Horizontally align ourselves with the framed text
    bool ret = Begin(name, NULL, window_flags);
    PopStyleVar();
    if (!ret)
    {
        EndPopup();
        IM_ASSERT(0);   // This should never happen as we tested for IsPopupOpen() above
        return false;
    }
    return true;
}